

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall pbrt::ParsedScene::AttributeBegin(ParsedScene *this,FileLoc loc)

{
  char *fmt;
  pair<char,_pbrt::FileLoc> local_30;
  
  if (this->currentApiState == OptionsBlock) {
    fmt = "Scene description must be inside world block; \"%s\" not allowed. Ignoring.";
  }
  else {
    if (this->currentApiState != Uninitialized) {
      std::
      vector<pbrt::ParsedScene::GraphicsState,_std::allocator<pbrt::ParsedScene::GraphicsState>_>::
      push_back(&this->pushedGraphicsStates,this->graphicsState);
      std::vector<pbrt::TransformSet,_std::allocator<pbrt::TransformSet>_>::push_back
                (&this->pushedTransforms,&this->curTransform);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->pushedActiveTransformBits,&this->activeTransformBits);
      local_30.first = 'a';
      local_30.second.line = loc.line;
      local_30.second.column = loc.column;
      local_30.second.filename._M_len = loc.filename._M_len;
      local_30.second.filename._M_str = loc.filename._M_str;
      std::vector<std::pair<char,pbrt::FileLoc>,std::allocator<std::pair<char,pbrt::FileLoc>>>::
      emplace_back<std::pair<char,pbrt::FileLoc>>
                ((vector<std::pair<char,pbrt::FileLoc>,std::allocator<std::pair<char,pbrt::FileLoc>>>
                  *)&this->pushStack,&local_30);
      return;
    }
    fmt = "pbrtInit() must be before calling \"%s()\". Ignoring.";
  }
  Error<char_const(&)[15]>(&loc,fmt,(char (*) [15])0x2e50b3c);
  return;
}

Assistant:

void ParsedScene::AttributeBegin(FileLoc loc) {
    VERIFY_WORLD("AttributeBegin");

    pushedGraphicsStates.push_back(*graphicsState);

    pushedTransforms.push_back(curTransform);
    pushedActiveTransformBits.push_back(activeTransformBits);

    pushStack.push_back(std::make_pair('a', loc));
}